

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O0

tri * load_obj(char *file_name,size_t *tri_count)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_110;
  size_t i;
  tri *tris;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> tri_vec;
  size_t *tri_count_local;
  char *file_name_local;
  
  tri_vec.super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tri_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,file_name,&local_e9);
  load_obj<float>((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *)
                  local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  sVar1 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                    ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
                     )local_c8);
  *(size_type *)
   ((tri_vec.
     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>.
     _M_impl.super__Vector_impl_data._M_end_of_storage)->p0).values = sVar1;
  sVar1 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                    ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
                     )local_c8);
  if (sVar1 == 0) {
    file_name_local = (char *)0x0;
  }
  else {
    sVar1 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::size
                      ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                        *)local_c8);
    file_name_local = (char *)malloc(sVar1 * 0x24);
    for (local_110 = 0;
        sVar1 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
                size((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *
                     )local_c8), local_110 < sVar1; local_110 = local_110 + 1) {
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24) = (pvVar2->p0).values[0];
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24 + 4) = (pvVar2->p0).values[1];
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24 + 8) = (pvVar2->p0).values[2];
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24 + 0xc) = (pvVar2->p1).values[0];
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24 + 0x10) = (pvVar2->p1).values[1];
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24 + 0x14) = (pvVar2->p1).values[2];
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24 + 0x18) = (pvVar2->p2).values[0];
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24 + 0x1c) = (pvVar2->p2).values[1];
      pvVar2 = std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
               operator[]((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                           *)local_c8,local_110);
      *(float *)(file_name_local + local_110 * 0x24 + 0x20) = (pvVar2->p2).values[2];
    }
  }
  std::vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::~vector
            ((vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> *)
             local_c8);
  return (tri *)file_name_local;
}

Assistant:

tri* load_obj(const char* file_name, size_t* tri_count) {
    auto tri_vec = load_obj<float>(file_name);
    *tri_count = tri_vec.size();
    if (tri_vec.size() == 0)
        return NULL;
    tri* tris = reinterpret_cast<tri*>(malloc(sizeof(tri) * tri_vec.size()));
    for (size_t i = 0; i < tri_vec.size(); ++i) {
        tris[i].v[0].x = tri_vec[i].p0[0];
        tris[i].v[0].y = tri_vec[i].p0[1];
        tris[i].v[0].z = tri_vec[i].p0[2];
        tris[i].v[1].x = tri_vec[i].p1[0];
        tris[i].v[1].y = tri_vec[i].p1[1];
        tris[i].v[1].z = tri_vec[i].p1[2];
        tris[i].v[2].x = tri_vec[i].p2[0];
        tris[i].v[2].y = tri_vec[i].p2[1];
        tris[i].v[2].z = tri_vec[i].p2[2];
    }
    return tris;
}